

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMerge.c
# Opt level: O2

Vec_Int_t * Abc_NtkLutMerge(Abc_Ntk_t *pNtk,Nwk_LMPars_t *pPars)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  abctime aVar3;
  Abc_Obj_t *pAVar4;
  Nwk_Grf_t *p;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Vec_Ptr_t *p_03;
  void *pvVar5;
  abctime aVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  uint i;
  int i_00;
  uint local_70;
  
  aVar3 = Abc_Clock();
  iVar8 = 0;
  for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar7);
    if ((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) {
      iVar8 = iVar8 + (uint)((pAVar4->vFanins).nSize <= pPars->nMaxLutSize);
    }
  }
  p = Nwk_ManGraphAlloc(iVar8);
  p_00 = Vec_PtrAlloc(iVar8);
  p_01 = Vec_PtrAlloc(iVar8);
  p_02 = Vec_PtrAlloc(iVar8);
  p_03 = Vec_PtrAlloc(iVar8);
  local_70 = 0;
  for (iVar7 = 0; iVar7 < pNtk->vObjs->nSize; iVar7 = iVar7 + 1) {
    pAVar4 = Abc_NtkObj(pNtk,iVar7);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7)) &&
       ((pAVar4->vFanins).nSize <= pPars->nMaxLutSize)) {
      Abc_NtkCollectOverlapCands(pAVar4,p_02,pPars);
      if (pPars->fUseDiffSupp != 0) {
        Abc_NtkCollectNonOverlapCands(pAVar4,p_00,p_01,p_03,pPars);
      }
      uVar1 = p_02->nSize;
      iVar8 = p_03->nSize;
      if (uVar1 != 0 || iVar8 != 0) {
        uVar9 = 0;
        i = 0;
        if (0 < (int)uVar1) {
          uVar9 = uVar1;
          i = 0;
        }
        for (; uVar9 != i; i = i + 1) {
          pvVar5 = Vec_PtrEntry(p_02,i);
          Nwk_ManGraphHashEdge(p,pAVar4->Id,*(int *)((long)pvVar5 + 0x10));
        }
        i_00 = 0;
        iVar10 = 0;
        if (0 < iVar8) {
          iVar10 = iVar8;
        }
        for (; iVar10 != i_00; i_00 = i_00 + 1) {
          pvVar5 = Vec_PtrEntry(p_03,i_00);
          Nwk_ManGraphHashEdge(p,pAVar4->Id,*(int *)((long)pvVar5 + 0x10));
        }
        local_70 = local_70 + uVar1 + iVar8;
        if (pPars->fVeryVerbose != 0) {
          uVar9 = (pAVar4->vFanins).nSize;
          printf("Node %6d : Fanins = %d. Fanouts = %3d.  Cand1 = %3d. Cand2 = %3d.\n",
                 (ulong)(uint)pAVar4->Id,(ulong)uVar9,(ulong)uVar9,(ulong)uVar1);
        }
      }
    }
  }
  Vec_PtrFree(p_00);
  Vec_PtrFree(p_01);
  Vec_PtrFree(p_02);
  Vec_PtrFree(p_03);
  if (pPars->fVerbose != 0) {
    iVar7 = 0x7a653d;
    printf("Mergable LUTs = %6d. Total cands = %6d. ",(ulong)(uint)p->nVertsMax,(ulong)local_70);
    Abc_Print(iVar7,"%s =","Deriving graph");
    aVar6 = Abc_Clock();
    Abc_Print(iVar7,"%9.2f sec\n",(double)(aVar6 - aVar3) / 1000000.0);
  }
  aVar3 = Abc_Clock();
  Nwk_ManGraphSolve(p);
  if (pPars->fVerbose != 0) {
    iVar7 = 0x7a6575;
    printf("GRAPH: Nodes = %6d. Edges = %6d.  Pairs = %6d.  ",(ulong)(uint)p->nVerts,
           (ulong)(uint)p->nEdges,(long)p->vPairs->nSize / 2 & 0xffffffff);
    Abc_Print(iVar7,"%s =","Solving");
    aVar6 = Abc_Clock();
    Abc_Print(iVar7,"%9.2f sec\n",(double)(aVar6 - aVar3) / 1000000.0);
    Nwk_ManGraphReportMemoryUsage(p);
  }
  pVVar2 = p->vPairs;
  p->vPairs = (Vec_Int_t *)0x0;
  Nwk_ManGraphFree(p);
  return pVVar2;
}

Assistant:

Vec_Int_t * Abc_NtkLutMerge( Abc_Ntk_t * pNtk, Nwk_LMPars_t * pPars )
{
    Nwk_Grf_t * p;
    Vec_Int_t * vResult;
    Vec_Ptr_t * vStart, * vNext, * vCands1, * vCands2;
    Abc_Obj_t * pLut, * pCand;
    int i, k, nVertsMax, nCands;
    abctime clk = Abc_Clock();
    // count the number of vertices
    nVertsMax = 0;
    Abc_NtkForEachNode( pNtk, pLut, i )
        nVertsMax += (int)(Abc_ObjFaninNum(pLut) <= pPars->nMaxLutSize);
    p = Nwk_ManGraphAlloc( nVertsMax );
    // create graph
    vStart  = Vec_PtrAlloc( 1000 );
    vNext   = Vec_PtrAlloc( 1000 );
    vCands1 = Vec_PtrAlloc( 1000 );
    vCands2 = Vec_PtrAlloc( 1000 );
    nCands  = 0;
    Abc_NtkForEachNode( pNtk, pLut, i )
    {
        if ( Abc_ObjFaninNum(pLut) > pPars->nMaxLutSize )
            continue;
        Abc_NtkCollectOverlapCands( pLut, vCands1, pPars );
        if ( pPars->fUseDiffSupp )
            Abc_NtkCollectNonOverlapCands( pLut, vStart, vNext, vCands2, pPars );
        if ( Vec_PtrSize(vCands1) == 0 && Vec_PtrSize(vCands2) == 0 )
            continue;
        nCands += Vec_PtrSize(vCands1) + Vec_PtrSize(vCands2);
        // save candidates
        Vec_PtrForEachEntry( Abc_Obj_t *, vCands1, pCand, k )
            Nwk_ManGraphHashEdge( p, Abc_ObjId(pLut), Abc_ObjId(pCand) );
        Vec_PtrForEachEntry( Abc_Obj_t *, vCands2, pCand, k )
            Nwk_ManGraphHashEdge( p, Abc_ObjId(pLut), Abc_ObjId(pCand) );
        // print statistics about this node
        if ( pPars->fVeryVerbose )
        printf( "Node %6d : Fanins = %d. Fanouts = %3d.  Cand1 = %3d. Cand2 = %3d.\n",
            Abc_ObjId(pLut), Abc_ObjFaninNum(pLut), Abc_ObjFaninNum(pLut), 
            Vec_PtrSize(vCands1), Vec_PtrSize(vCands2) );
    }
    Vec_PtrFree( vStart );
    Vec_PtrFree( vNext );
    Vec_PtrFree( vCands1 );
    Vec_PtrFree( vCands2 );
    if ( pPars->fVerbose )
    {
        printf( "Mergable LUTs = %6d. Total cands = %6d. ", p->nVertsMax, nCands );
        ABC_PRT( "Deriving graph", Abc_Clock() - clk );
    }
    // solve the graph problem
    clk = Abc_Clock();
    Nwk_ManGraphSolve( p );
    if ( pPars->fVerbose )
    {
        printf( "GRAPH: Nodes = %6d. Edges = %6d.  Pairs = %6d.  ", 
            p->nVerts, p->nEdges, Vec_IntSize(p->vPairs)/2 );
        ABC_PRT( "Solving", Abc_Clock() - clk );
        Nwk_ManGraphReportMemoryUsage( p );
    }
    vResult = p->vPairs; p->vPairs = NULL;
/*
    for ( i = 0; i < vResult->nSize; i += 2 )
        printf( "(%d,%d) ", vResult->pArray[i], vResult->pArray[i+1] );
    printf( "\n" );
*/
    Nwk_ManGraphFree( p );
    return vResult;
}